

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O1

void Hacl_Bignum256_32_mul(uint32_t *a,uint32_t *b,uint32_t *res)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  res[0xc] = 0;
  res[0xd] = 0;
  res[0xe] = 0;
  res[0xf] = 0;
  res[8] = 0;
  res[9] = 0;
  res[10] = 0;
  res[0xb] = 0;
  res[4] = 0;
  res[5] = 0;
  res[6] = 0;
  res[7] = 0;
  res[0] = 0;
  res[1] = 0;
  res[2] = 0;
  res[3] = 0;
  uVar11 = (ulong)*b;
  uVar1 = *a;
  *res = (uint32_t)(uVar1 * uVar11);
  uVar4 = a[1] * uVar11 + (ulong)res[1] + (uVar1 * uVar11 >> 0x20);
  res[1] = (uint32_t)uVar4;
  uVar5 = a[2] * uVar11 + (ulong)res[2] + (uVar4 >> 0x20);
  res[2] = (uint32_t)uVar5;
  uVar7 = a[3] * uVar11 + (ulong)res[3] + (uVar5 >> 0x20);
  res[3] = (uint32_t)uVar7;
  uVar8 = a[4] * uVar11 + (ulong)res[4] + (uVar7 >> 0x20);
  res[4] = (uint32_t)uVar8;
  uVar2 = a[5] * uVar11 + (ulong)res[5] + (uVar8 >> 0x20);
  res[5] = (uint32_t)uVar2;
  uVar9 = a[6] * uVar11 + (ulong)res[6] + (uVar2 >> 0x20);
  res[6] = (uint32_t)uVar9;
  uVar3 = a[7] * uVar11 + (ulong)res[7] + (uVar9 >> 0x20);
  *(ulong *)(res + 7) = uVar3;
  uVar6 = (ulong)b[1];
  uVar11 = (uVar4 & 0xffffffff) + *a * uVar6;
  res[1] = (uint32_t)uVar11;
  uVar11 = (uVar5 & 0xffffffff) + (uVar11 >> 0x20) + a[1] * uVar6;
  res[2] = (uint32_t)uVar11;
  uVar4 = (uVar7 & 0xffffffff) + a[2] * uVar6 + (uVar11 >> 0x20);
  res[3] = (uint32_t)uVar4;
  uVar5 = (uVar8 & 0xffffffff) + a[3] * uVar6 + (uVar4 >> 0x20);
  res[4] = (uint32_t)uVar5;
  uVar7 = (uVar2 & 0xffffffff) + a[4] * uVar6 + (uVar5 >> 0x20);
  res[5] = (uint32_t)uVar7;
  uVar8 = (uVar9 & 0xffffffff) + a[5] * uVar6 + (uVar7 >> 0x20);
  res[6] = (uint32_t)uVar8;
  uVar10 = (uVar3 & 0xffffffff) + a[6] * uVar6 + (uVar8 >> 0x20);
  res[7] = (uint32_t)uVar10;
  uVar9 = a[7] * uVar6 + (uVar3 >> 0x20) + (uVar10 >> 0x20);
  *(ulong *)(res + 8) = uVar9;
  uVar2 = (ulong)b[2];
  uVar11 = (uVar11 & 0xffffffff) + *a * uVar2;
  res[2] = (uint32_t)uVar11;
  uVar11 = (uVar4 & 0xffffffff) + (uVar11 >> 0x20) + a[1] * uVar2;
  res[3] = (uint32_t)uVar11;
  uVar3 = (uVar5 & 0xffffffff) + a[2] * uVar2 + (uVar11 >> 0x20);
  res[4] = (uint32_t)uVar3;
  uVar6 = (uVar7 & 0xffffffff) + a[3] * uVar2 + (uVar3 >> 0x20);
  res[5] = (uint32_t)uVar6;
  uVar4 = (uVar8 & 0xffffffff) + a[4] * uVar2 + (uVar6 >> 0x20);
  res[6] = (uint32_t)uVar4;
  uVar5 = (uVar10 & 0xffffffff) + a[5] * uVar2 + (uVar4 >> 0x20);
  res[7] = (uint32_t)uVar5;
  uVar8 = (uVar9 & 0xffffffff) + a[6] * uVar2 + (uVar5 >> 0x20);
  res[8] = (uint32_t)uVar8;
  uVar7 = a[7] * uVar2 + (uVar9 >> 0x20) + (uVar8 >> 0x20);
  *(ulong *)(res + 9) = uVar7;
  uVar2 = (ulong)b[3];
  uVar11 = (uVar11 & 0xffffffff) + *a * uVar2;
  res[3] = (uint32_t)uVar11;
  uVar11 = (uVar3 & 0xffffffff) + (uVar11 >> 0x20) + a[1] * uVar2;
  res[4] = (uint32_t)uVar11;
  uVar3 = (uVar6 & 0xffffffff) + a[2] * uVar2 + (uVar11 >> 0x20);
  res[5] = (uint32_t)uVar3;
  uVar6 = (uVar4 & 0xffffffff) + a[3] * uVar2 + (uVar3 >> 0x20);
  res[6] = (uint32_t)uVar6;
  uVar4 = (uVar5 & 0xffffffff) + a[4] * uVar2 + (uVar6 >> 0x20);
  res[7] = (uint32_t)uVar4;
  uVar5 = (uVar8 & 0xffffffff) + a[5] * uVar2 + (uVar4 >> 0x20);
  res[8] = (uint32_t)uVar5;
  uVar8 = (uVar7 & 0xffffffff) + a[6] * uVar2 + (uVar5 >> 0x20);
  res[9] = (uint32_t)uVar8;
  uVar7 = a[7] * uVar2 + (uVar7 >> 0x20) + (uVar8 >> 0x20);
  *(ulong *)(res + 10) = uVar7;
  uVar2 = (ulong)b[4];
  uVar11 = (uVar11 & 0xffffffff) + *a * uVar2;
  res[4] = (uint32_t)uVar11;
  uVar11 = (uVar3 & 0xffffffff) + (uVar11 >> 0x20) + a[1] * uVar2;
  res[5] = (uint32_t)uVar11;
  uVar3 = (uVar6 & 0xffffffff) + a[2] * uVar2 + (uVar11 >> 0x20);
  res[6] = (uint32_t)uVar3;
  uVar6 = (uVar4 & 0xffffffff) + a[3] * uVar2 + (uVar3 >> 0x20);
  res[7] = (uint32_t)uVar6;
  uVar4 = (uVar5 & 0xffffffff) + a[4] * uVar2 + (uVar6 >> 0x20);
  res[8] = (uint32_t)uVar4;
  uVar5 = (uVar8 & 0xffffffff) + a[5] * uVar2 + (uVar4 >> 0x20);
  res[9] = (uint32_t)uVar5;
  uVar8 = (uVar7 & 0xffffffff) + a[6] * uVar2 + (uVar5 >> 0x20);
  res[10] = (uint32_t)uVar8;
  uVar7 = a[7] * uVar2 + (uVar7 >> 0x20) + (uVar8 >> 0x20);
  *(ulong *)(res + 0xb) = uVar7;
  uVar2 = (ulong)b[5];
  uVar11 = (uVar11 & 0xffffffff) + *a * uVar2;
  res[5] = (uint32_t)uVar11;
  uVar11 = (uVar3 & 0xffffffff) + (uVar11 >> 0x20) + a[1] * uVar2;
  res[6] = (uint32_t)uVar11;
  uVar3 = (uVar6 & 0xffffffff) + a[2] * uVar2 + (uVar11 >> 0x20);
  res[7] = (uint32_t)uVar3;
  uVar6 = (uVar4 & 0xffffffff) + a[3] * uVar2 + (uVar3 >> 0x20);
  res[8] = (uint32_t)uVar6;
  uVar4 = (uVar5 & 0xffffffff) + a[4] * uVar2 + (uVar6 >> 0x20);
  res[9] = (uint32_t)uVar4;
  uVar5 = (uVar8 & 0xffffffff) + a[5] * uVar2 + (uVar4 >> 0x20);
  res[10] = (uint32_t)uVar5;
  uVar8 = (uVar7 & 0xffffffff) + a[6] * uVar2 + (uVar5 >> 0x20);
  res[0xb] = (uint32_t)uVar8;
  uVar7 = a[7] * uVar2 + (uVar7 >> 0x20) + (uVar8 >> 0x20);
  *(ulong *)(res + 0xc) = uVar7;
  uVar2 = (ulong)b[6];
  uVar11 = (uVar11 & 0xffffffff) + *a * uVar2;
  res[6] = (uint32_t)uVar11;
  uVar11 = (uVar3 & 0xffffffff) + (uVar11 >> 0x20) + a[1] * uVar2;
  res[7] = (uint32_t)uVar11;
  uVar3 = (uVar6 & 0xffffffff) + a[2] * uVar2 + (uVar11 >> 0x20);
  res[8] = (uint32_t)uVar3;
  uVar6 = (uVar4 & 0xffffffff) + a[3] * uVar2 + (uVar3 >> 0x20);
  res[9] = (uint32_t)uVar6;
  uVar4 = (uVar5 & 0xffffffff) + a[4] * uVar2 + (uVar6 >> 0x20);
  res[10] = (uint32_t)uVar4;
  uVar5 = (uVar8 & 0xffffffff) + a[5] * uVar2 + (uVar4 >> 0x20);
  res[0xb] = (uint32_t)uVar5;
  uVar8 = (uVar7 & 0xffffffff) + a[6] * uVar2 + (uVar5 >> 0x20);
  res[0xc] = (uint32_t)uVar8;
  uVar7 = a[7] * uVar2 + (uVar7 >> 0x20) + (uVar8 >> 0x20);
  *(ulong *)(res + 0xd) = uVar7;
  uVar2 = (ulong)b[7];
  uVar11 = (uVar11 & 0xffffffff) + *a * uVar2;
  res[7] = (uint32_t)uVar11;
  uVar11 = (uVar3 & 0xffffffff) + (uVar11 >> 0x20) + a[1] * uVar2;
  res[8] = (uint32_t)uVar11;
  uVar11 = (uVar6 & 0xffffffff) + a[2] * uVar2 + (uVar11 >> 0x20);
  res[9] = (uint32_t)uVar11;
  uVar11 = (uVar4 & 0xffffffff) + a[3] * uVar2 + (uVar11 >> 0x20);
  res[10] = (uint32_t)uVar11;
  uVar11 = (uVar5 & 0xffffffff) + a[4] * uVar2 + (uVar11 >> 0x20);
  res[0xb] = (uint32_t)uVar11;
  uVar11 = (uVar8 & 0xffffffff) + a[5] * uVar2 + (uVar11 >> 0x20);
  res[0xc] = (uint32_t)uVar11;
  uVar11 = (uVar7 & 0xffffffff) + a[6] * uVar2 + (uVar11 >> 0x20);
  res[0xd] = (uint32_t)uVar11;
  *(ulong *)(res + 0xe) = a[7] * uVar2 + (uVar7 >> 0x20) + (uVar11 >> 0x20);
  return;
}

Assistant:

void Hacl_Bignum256_32_mul(uint32_t *a, uint32_t *b, uint32_t *res)
{
  memset(res, 0U, 16U * sizeof (uint32_t));
  KRML_MAYBE_FOR8(i0,
    0U,
    8U,
    1U,
    uint32_t bj = b[i0];
    uint32_t *res_j = res + i0;
    uint32_t c = 0U;
    KRML_MAYBE_FOR2(i,
      0U,
      2U,
      1U,
      uint32_t a_i = a[4U * i];
      uint32_t *res_i0 = res_j + 4U * i;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, bj, c, res_i0);
      uint32_t a_i0 = a[4U * i + 1U];
      uint32_t *res_i1 = res_j + 4U * i + 1U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i0, bj, c, res_i1);
      uint32_t a_i1 = a[4U * i + 2U];
      uint32_t *res_i2 = res_j + 4U * i + 2U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i1, bj, c, res_i2);
      uint32_t a_i2 = a[4U * i + 3U];
      uint32_t *res_i = res_j + 4U * i + 3U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i2, bj, c, res_i););
    uint32_t r = c;
    res[8U + i0] = r;);
}